

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32_ssse3.c
# Opt level: O3

uint32_t adler32_ssse3(uint32_t adler,uint8_t *buf,size_t len)

{
  undefined1 (*pauVar1) [16];
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t i;
  long lVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  undefined1 auVar28 [16];
  int iVar29;
  int iVar30;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  undefined1 auVar31 [16];
  int iVar37;
  undefined1 auVar38 [16];
  
  uVar9 = (ulong)adler & 0xffff;
  uVar12 = adler >> 0x10;
  uVar5 = (ulong)uVar12;
  if (len == 1) {
    uVar6 = (int)uVar9 + (uint)*buf;
    uVar7 = uVar6 - 0xfff1;
    if (uVar6 < 0xfff1) {
      uVar7 = uVar6;
    }
    return ((uVar12 + uVar7) % 0xfff1) * 0x10000 + uVar7;
  }
  if (buf == (uint8_t *)0x0) {
    return 1;
  }
  if (len < 0x10) {
    if (len != 0) {
      sVar4 = 0;
      do {
        uVar12 = (int)uVar9 + (uint)buf[sVar4];
        uVar9 = (ulong)uVar12;
        uVar5 = (ulong)((int)uVar5 + uVar12);
        sVar4 = sVar4 + 1;
      } while (len != sVar4);
    }
LAB_00103674:
    return (int)(uVar5 % 0xfff1) << 0x10 | (uint)(uVar9 % 0xfff1);
  }
  uVar2 = 0x15b0;
  uVar8 = (ulong)((uint)buf & 0xf);
  if (((ulong)buf & 0xf) == 0) goto LAB_0010358c;
  if (0x20 - uVar8 <= len) {
    lVar3 = 0x10 - uVar8;
    lVar10 = 0;
    do {
      uVar12 = (int)uVar9 + (uint)buf[lVar10];
      uVar9 = (ulong)uVar12;
      uVar5 = (ulong)((int)uVar5 + uVar12);
      lVar10 = lVar10 + 1;
    } while (lVar3 != lVar10);
    buf = buf + lVar3;
    len = len - lVar3;
    uVar2 = uVar8 | 0x15a0;
    goto LAB_0010358c;
  }
  len = len - 0x10;
  iVar14 = 0;
  iVar16 = 0;
  iVar18 = 0;
  iVar19 = 0;
  iVar20 = 0;
  iVar21 = 0;
  iVar22 = 0;
  uVar2 = 0;
  iVar27 = (int)uVar9;
  iVar11 = 0;
  iVar13 = 0;
  iVar15 = 0;
  do {
    auVar28 = *(undefined1 (*) [16])buf;
    buf = (uint8_t *)((long)buf + 0x10);
    auVar31 = psadbw((undefined1  [16])0x0,auVar28);
    iVar30 = auVar31._0_4_ + iVar27;
    iVar33 = auVar31._4_4_ + iVar11;
    iVar35 = auVar31._8_4_ + iVar13;
    iVar37 = auVar31._12_4_ + iVar15;
    iVar19 = iVar19 + iVar27;
    iVar20 = iVar20 + iVar11;
    iVar21 = iVar21 + iVar13;
    iVar22 = iVar22 + iVar15;
    auVar28 = pmaddubsw(auVar28,_DAT_0011bce0);
    auVar28 = pmaddwd(auVar28,_DAT_0011bcd0);
    uVar12 = uVar12 + auVar28._0_4_;
    iVar14 = iVar14 + auVar28._4_4_;
    iVar16 = iVar16 + auVar28._8_4_;
    iVar18 = iVar18 + auVar28._12_4_;
    while (uVar2 < 0x10) {
      auVar28._0_4_ = uVar12 + iVar19 * 0x10;
      auVar28._4_4_ = iVar14 + iVar20 * 0x10;
      auVar28._8_4_ = iVar16 + iVar21 * 0x10;
      auVar28._12_4_ = iVar18 + iVar22 * 0x10;
      auVar28 = phaddd(auVar28,auVar28);
      uVar9 = (ulong)(uint)(iVar35 + iVar30) % 0xfff1;
      auVar28 = phaddd(auVar28,auVar28);
      uVar5 = (ulong)auVar28._0_4_ % 0xfff1;
      uVar2 = 0x15b0;
LAB_0010358c:
      if (len < 0x10) {
        if (len != 0) {
          uVar2 = 0;
          do {
            uVar12 = (int)uVar9 + (uint)(byte)(*(undefined1 (*) [16])buf)[uVar2];
            uVar9 = (ulong)uVar12;
            uVar5 = (ulong)((int)uVar5 + uVar12);
            uVar2 = uVar2 + 1;
          } while (len != uVar2);
        }
        goto LAB_00103674;
      }
      iVar30 = (int)uVar9;
      iVar33 = 0;
      iVar35 = 0;
      iVar37 = 0;
      iVar27 = (int)uVar5;
      iVar14 = 0;
      iVar16 = 0;
      iVar18 = 0;
      if (len < uVar2) {
        uVar2 = len;
      }
      uVar2 = uVar2 & 0xfffffffffffffff0;
      uVar9 = len - uVar2;
      iVar19 = 0;
      iVar20 = 0;
      iVar21 = 0;
      iVar22 = 0;
      if (len < 0x20) {
        iVar11 = 0;
        iVar13 = 0;
        iVar15 = 0;
        iVar17 = 0;
        iVar29 = 0;
        iVar32 = 0;
        iVar34 = 0;
        iVar36 = 0;
      }
      else {
        iVar29 = 0;
        iVar32 = 0;
        iVar34 = 0;
        iVar36 = 0;
        iVar11 = 0;
        iVar13 = 0;
        iVar15 = 0;
        iVar17 = 0;
        iVar23 = iVar30;
        iVar24 = iVar33;
        iVar25 = iVar35;
        iVar26 = iVar37;
        do {
          auVar28 = *(undefined1 (*) [16])buf;
          pauVar1 = (undefined1 (*) [16])((long)buf + 0x10);
          buf = (uint8_t *)((long)buf + 0x20);
          uVar2 = uVar2 - 0x20;
          auVar31 = psadbw(auVar28,(undefined1  [16])0x0);
          auVar38 = psadbw(*pauVar1,(undefined1  [16])0x0);
          iVar30 = auVar31._0_4_ + iVar23 + auVar38._0_4_;
          iVar33 = auVar31._4_4_ + iVar24 + auVar38._4_4_;
          iVar35 = auVar31._8_4_ + iVar25 + auVar38._8_4_;
          iVar37 = auVar31._12_4_ + iVar26 + auVar38._12_4_;
          iVar11 = iVar11 + iVar23;
          iVar13 = iVar13 + iVar24;
          iVar15 = iVar15 + iVar25;
          iVar17 = iVar17 + iVar26;
          auVar28 = pmaddubsw(auVar28,_DAT_0011bcc0);
          auVar28 = pmaddwd(auVar28,_DAT_0011bcd0);
          iVar27 = iVar27 + auVar28._0_4_;
          iVar14 = iVar14 + auVar28._4_4_;
          iVar16 = iVar16 + auVar28._8_4_;
          iVar18 = iVar18 + auVar28._12_4_;
          auVar28 = pmaddubsw(*pauVar1,_DAT_0011bce0);
          auVar28 = pmaddwd(auVar28,_DAT_0011bcd0);
          iVar29 = iVar29 + auVar28._0_4_;
          iVar32 = iVar32 + auVar28._4_4_;
          iVar34 = iVar34 + auVar28._8_4_;
          iVar36 = iVar36 + auVar28._12_4_;
          iVar23 = iVar30;
          iVar24 = iVar33;
          iVar25 = iVar35;
          iVar26 = iVar37;
        } while (0x1f < uVar2);
        iVar11 = iVar11 * 0x20;
        iVar13 = iVar13 * 0x20;
        iVar15 = iVar15 * 0x20;
        iVar17 = iVar17 * 0x20;
      }
      uVar12 = iVar11 + iVar29 + iVar27;
      iVar14 = iVar13 + iVar32 + iVar14;
      iVar16 = iVar15 + iVar34 + iVar16;
      iVar18 = iVar17 + iVar36 + iVar18;
      len = uVar9;
    }
    uVar2 = uVar2 - 0x10;
    iVar27 = iVar30;
    iVar11 = iVar33;
    iVar13 = iVar35;
    iVar15 = iVar37;
  } while( true );
}

Assistant:

Z_INTERNAL uint32_t adler32_ssse3(uint32_t adler, const uint8_t *buf, size_t len) {
    uint32_t sum2;

     /* split Adler-32 into component sums */
    sum2 = (adler >> 16) & 0xffff;
    adler &= 0xffff;

    /* in case user likes doing a byte at a time, keep it fast */
    if (UNLIKELY(len == 1))
        return adler32_len_1(adler, buf, sum2);

    /* initial Adler-32 value (deferred check for len == 1 speed) */
    if (UNLIKELY(buf == NULL))
        return 1L;

    /* in case short lengths are provided, keep it somewhat fast */
    if (UNLIKELY(len < 16))
        return adler32_len_16(adler, buf, len, sum2);

    const __m128i dot2v = _mm_setr_epi8(32, 31, 30, 29, 28, 27, 26, 25, 24, 23, 22, 21, 20, 19, 18, 17);
    const __m128i dot2v_0 = _mm_setr_epi8(16, 15, 14, 13, 12, 11, 10, 9, 8, 7, 6, 5, 4, 3, 2, 1);
    const __m128i dot3v = _mm_set1_epi16(1);
    const __m128i zero = _mm_setzero_si128();

    __m128i vbuf, vs1_0, vs3, vs1, vs2, vs2_0, v_sad_sum1, v_short_sum2, v_short_sum2_0,
            vbuf_0, v_sad_sum2, vsum2, vsum2_0;

    /* If our buffer is unaligned (likely), make the determination whether
     * or not there's enough of a buffer to consume to make the scalar, aligning
     * additions worthwhile or if it's worth it to just eat the cost of an unaligned
     * load. This is a pretty simple test, just test if 16 - the remainder + len is
     * < 16 */
    size_t max_iters = NMAX;
    size_t rem = (uintptr_t)buf & 15;
    size_t align_offset = 16 - rem;
    size_t k = 0;
    if (rem) {
        if (len < 16 + align_offset) {
            /* Let's eat the cost of this one unaligned load so that
             * we don't completely skip over the vectorization. Doing
             * 16 bytes at a time unaligned is better than 16 + <= 15
             * sums */
            vbuf = _mm_loadu_si128((__m128i*)buf);
            len -= 16;
            buf += 16;
            vs1 = _mm_cvtsi32_si128(adler);
            vs2 = _mm_cvtsi32_si128(sum2);
            vs3 = _mm_setzero_si128();
            vs1_0 = vs1;
            goto unaligned_jmp;
        }

        for (size_t i = 0; i < align_offset; ++i) {
            adler += *(buf++);
            sum2 += adler;
        }

        /* lop off the max number of sums based on the scalar sums done
         * above */
        len -= align_offset;
        max_iters -= align_offset;
    }


    while (len >= 16) {
        vs1 = _mm_cvtsi32_si128(adler);
        vs2 = _mm_cvtsi32_si128(sum2);
        vs3 = _mm_setzero_si128();
        vs2_0 = _mm_setzero_si128();
        vs1_0 = vs1;

        k = (len < max_iters ? len : max_iters);
        k -= k % 16;
        len -= k;

        while (k >= 32) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 16 vs1 + sum( (16-i+1) c[i] )
            */
            vbuf = _mm_load_si128((__m128i*)buf);
            vbuf_0 = _mm_load_si128((__m128i*)(buf + 16));
            buf += 32;
            k -= 32;

            v_sad_sum1 = _mm_sad_epu8(vbuf, zero);
            v_sad_sum2 = _mm_sad_epu8(vbuf_0, zero);
            vs1 = _mm_add_epi32(v_sad_sum1, vs1);
            vs3 = _mm_add_epi32(vs1_0, vs3);

            vs1 = _mm_add_epi32(v_sad_sum2, vs1);
            v_short_sum2 = _mm_maddubs_epi16(vbuf, dot2v);
            vsum2 = _mm_madd_epi16(v_short_sum2, dot3v);
            v_short_sum2_0 = _mm_maddubs_epi16(vbuf_0, dot2v_0);
            vs2 = _mm_add_epi32(vsum2, vs2);
            vsum2_0 = _mm_madd_epi16(v_short_sum2_0, dot3v);
            vs2_0 = _mm_add_epi32(vsum2_0, vs2_0);
            vs1_0 = vs1;
        }

        vs2 = _mm_add_epi32(vs2_0, vs2);
        vs3 = _mm_slli_epi32(vs3, 5);
        vs2 = _mm_add_epi32(vs3, vs2);
        vs3 = _mm_setzero_si128();

        while (k >= 16) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 16 vs1 + sum( (16-i+1) c[i] )
            */
            vbuf = _mm_load_si128((__m128i*)buf);
            buf += 16;
            k -= 16;

unaligned_jmp:
            v_sad_sum1 = _mm_sad_epu8(vbuf, zero);
            vs1 = _mm_add_epi32(v_sad_sum1, vs1);
            vs3 = _mm_add_epi32(vs1_0, vs3);
            v_short_sum2 = _mm_maddubs_epi16(vbuf, dot2v_0);
            vsum2 = _mm_madd_epi16(v_short_sum2, dot3v);
            vs2 = _mm_add_epi32(vsum2, vs2);
            vs1_0 = vs1;
        }

        vs3 = _mm_slli_epi32(vs3, 4);
        vs2 = _mm_add_epi32(vs2, vs3);

        /* We don't actually need to do a full horizontal sum, since psadbw is actually doing
         * a partial reduction sum implicitly and only summing to integers in vector positions
         * 0 and 2. This saves us some contention on the shuffle port(s) */
        adler = partial_hsum(vs1) % BASE;
        sum2 = hsum(vs2) % BASE;
        max_iters = NMAX;
    }

    /* Process tail (len < 16).  */
    return adler32_len_16(adler, buf, len, sum2);
}